

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O1

int ffbinit(fitsfile *fptr,int *status)

{
  int iVar1;
  FITSfile *pFVar2;
  void *pvVar3;
  int iVar4;
  tcolumn *ptVar5;
  int *piVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  size_t sVar13;
  LONGLONG rowlen;
  long tfield;
  LONGLONG nrows;
  LONGLONG pcount;
  LONGLONG totalwidth;
  char name [75];
  char value [71];
  char comm [73];
  char message [81];
  LONGLONG local_1a0;
  int local_198;
  undefined4 uStack_194;
  long local_190;
  LONGLONG local_188;
  long local_180;
  char local_178;
  undefined2 uStack_177;
  int iStack_175;
  char local_128 [80];
  char local_d8 [80];
  char local_88 [88];
  
  if (0 < *status) {
    return *status;
  }
  if (fptr->HDUposition != fptr->Fptr->curhdu) {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  pFVar2 = fptr->Fptr;
  pFVar2->hdutype = 2;
  pFVar2->headend = pFVar2->logfilesize;
  iVar4 = ffgttb(fptr,&local_1a0,&local_190,&local_188,(long *)&local_198,status);
  if (iVar4 < 1) {
    pFVar2 = fptr->Fptr;
    pFVar2->rowlength = local_1a0;
    pFVar2->tfield = local_198;
    if (pFVar2->tilerow != (int *)0x0) {
      uVar12 = (uint)((pFVar2->znaxis[0] + -1) / pFVar2->tilesize[0]);
      if (uVar12 < 0x7fffffff) {
        uVar10 = 0;
        do {
          pvVar3 = fptr->Fptr->tiledata[uVar10];
          if (pvVar3 != (void *)0x0) {
            free(pvVar3);
          }
          pvVar3 = fptr->Fptr->tilenullarray[uVar10];
          if (pvVar3 != (void *)0x0) {
            free(pvVar3);
          }
          uVar10 = uVar10 + 1;
        } while (uVar12 + 1 != uVar10);
      }
      free(fptr->Fptr->tileanynull);
      free(fptr->Fptr->tiletype);
      free(fptr->Fptr->tiledatasize);
      free(fptr->Fptr->tilenullarray);
      free(fptr->Fptr->tiledata);
      free(fptr->Fptr->tilerow);
      pFVar2 = fptr->Fptr;
      pFVar2->tilenullarray = (void **)0x0;
      pFVar2->tileanynull = (int *)0x0;
      pFVar2->tiletype = (int *)0x0;
      pFVar2->tiledata = (void **)0x0;
      pFVar2->tilerow = (int *)0x0;
      pFVar2->tiledatasize = (long *)0x0;
    }
    ptVar5 = fptr->Fptr->tableptr;
    if (ptVar5 != (tcolumn *)0x0) {
      free(ptVar5);
    }
    sVar13 = CONCAT44(uStack_194,local_198);
    if ((long)sVar13 < 1) {
      ptVar5 = (tcolumn *)0x0;
    }
    else {
      ptVar5 = (tcolumn *)calloc(sVar13,0xa0);
      if (ptVar5 == (tcolumn *)0x0) {
        ffxmsg(5,"malloc failed to get memory for FITS table descriptors (ffbinit)");
        fptr->Fptr->tableptr = (tcolumn *)0x0;
        *status = 0x6f;
        return 0x6f;
      }
    }
    pFVar2 = fptr->Fptr;
    pFVar2->tableptr = ptVar5;
    if (0 < (long)sVar13) {
      do {
        ptVar5->ttype[0] = '\0';
        ptVar5->tscale = 1.0;
        ptVar5->tzero = 0.0;
        ptVar5->tnull = 0x4995cdd1;
        ptVar5->tdatatype = -9999;
        ptVar5->trepeat = 1;
        ptVar5->strnull[0] = '\0';
        ptVar5 = ptVar5 + 1;
        sVar13 = sVar13 - 1;
      } while (sVar13 != 0);
    }
    pFVar2->numrows = local_190;
    pFVar2->origrows = local_190;
    pFVar2->heapstart = local_190 * local_1a0;
    pFVar2->heapsize = local_188;
    pFVar2->compressimg = 0;
    iVar4 = 8;
    iVar11 = 0;
    do {
      ffgkyn(fptr,iVar4,&local_178,local_128,local_d8,status);
      if (*status == 0xcf) {
LAB_00181d51:
        *status = 0;
      }
      else if (*status == 0xcd) {
        sVar13 = strlen(local_128);
        (local_128 + sVar13)[0] = '\'';
        (local_128 + sVar13)[1] = '\0';
        goto LAB_00181d51;
      }
      iVar1 = *status;
      if (iVar1 == 0x6b) {
        ffxmsg(5,"END keyword not found in binary table header (ffbinit).");
        *status = 0xd2;
        return 0xd2;
      }
      if (0 < iVar1) {
        return iVar1;
      }
      if (local_178 == 'Z') {
        if (iStack_175 != 0x454741 ||
            CONCAT13((undefined1)iStack_175,CONCAT21(uStack_177,0x5a)) != 0x414d495a)
        goto LAB_00181da6;
        if (local_128[0] == 'T') {
          fptr->Fptr->compressimg = 1;
        }
      }
      else if (local_178 == 'T') {
        ffgtbp(fptr,&local_178,local_128,status);
      }
      else {
LAB_00181da6:
        if ((local_178 == 'E') &&
           (CONCAT13((undefined1)iStack_175,CONCAT21(uStack_177,0x45)) == 0x444e45))
        goto LAB_00181e14;
      }
      iVar11 = iVar11 + 1;
      if ((local_128[0] != '\0' || local_178 != '\0') || local_d8[0] != '\0') {
        iVar11 = 0;
      }
      iVar4 = iVar4 + 1;
    } while( true );
  }
LAB_00181b00:
  return *status;
LAB_00181e14:
  pFVar2 = fptr->Fptr;
  if (0 < CONCAT44(uStack_194,local_198)) {
    piVar6 = &pFVar2->tableptr->tdatatype;
    lVar7 = 0;
    do {
      if (*piVar6 == -9999) {
        ffkeyn("TFORM",(int)lVar7 + 1,&local_178,status);
        snprintf(local_88,0x51,"Required %s keyword not found (ffbinit).",&local_178);
        ffxmsg(5,local_88);
        *status = 0xe8;
        return 0xe8;
      }
      lVar7 = lVar7 + 1;
      piVar6 = piVar6 + 0x28;
    } while (CONCAT44(uStack_194,local_198) != lVar7);
  }
  pFVar2->headend = pFVar2->nextkey - (long)(iVar11 * 0x50 + 0x50);
  lVar8 = ((pFVar2->nextkey + -0x50) / 0xb40) * 0xb40;
  pFVar2->datastart = lVar8 + 0xb40;
  lVar9 = pFVar2->heapsize + pFVar2->heapstart;
  lVar7 = lVar9 + 0xb3f;
  pFVar2->headstart[(long)pFVar2->curhdu + 1] =
       ((lVar7 / 0xb40) * 0xb40 - lVar7) + lVar9 + lVar8 + 0x167f;
  ffgtbc(fptr,&local_180,status);
  if (local_180 != local_1a0) {
    snprintf(local_88,0x51,"NAXIS1 = %ld is not equal to the sum of column widths: %ld");
    ffxmsg(5,local_88);
    *status = 0xf1;
  }
  pFVar2 = fptr->Fptr;
  pFVar2->nextkey = pFVar2->headstart[pFVar2->curhdu];
  if (pFVar2->compressimg == 1) {
    imcomp_get_compressed_image_par(fptr,status);
  }
  goto LAB_00181b00;
}

Assistant:

int ffbinit(fitsfile *fptr,     /* I - FITS file pointer */
            int *status)        /* IO - error status     */
{
/*
  initialize the parameters defining the structure of a binary table 
*/
    int  ii, nspace, ntilebins;
    long tfield;
    LONGLONG pcount, rowlen, nrows, totalwidth;
    tcolumn *colptr = 0;
    char name[FLEN_KEYWORD], value[FLEN_VALUE], comm[FLEN_COMMENT];
    char message[FLEN_ERRMSG];

    if (*status > 0)
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    (fptr->Fptr)->hdutype = BINARY_TBL;  /* set that this is a binary table */
    (fptr->Fptr)->headend = (fptr->Fptr)->logfilesize;  /* set max size */

    /* get table parameters and test that the header is valid: */
    if (ffgttb(fptr, &rowlen, &nrows, &pcount, &tfield, status) > 0)
       return(*status);

    (fptr->Fptr)->rowlength =  rowlen; /* store length of a row */
    (fptr->Fptr)->tfield = tfield; /* store number of table fields in row */

     /* free the tile-compressed image cache, if it exists */
     if ((fptr->Fptr)->tilerow) {

           ntilebins = 
	    (((fptr->Fptr)->znaxis[0] - 1) / ((fptr->Fptr)->tilesize[0])) + 1;

           for (ii = 0; ii < ntilebins; ii++) {
             if ((fptr->Fptr)->tiledata[ii]) {
	       free((fptr->Fptr)->tiledata[ii]);
             }

             if ((fptr->Fptr)->tilenullarray[ii]) {
	       free((fptr->Fptr)->tilenullarray[ii]);
             }
            }
	    
	    free((fptr->Fptr)->tileanynull);
	    free((fptr->Fptr)->tiletype);	   
	    free((fptr->Fptr)->tiledatasize);
	    free((fptr->Fptr)->tilenullarray);
	    free((fptr->Fptr)->tiledata);
	    free((fptr->Fptr)->tilerow);

	    (fptr->Fptr)->tileanynull = 0;
	    (fptr->Fptr)->tiletype = 0;	   
	    (fptr->Fptr)->tiledatasize = 0;
	    (fptr->Fptr)->tilenullarray = 0;
	    (fptr->Fptr)->tiledata = 0;
	    (fptr->Fptr)->tilerow = 0;
     }

    if ((fptr->Fptr)->tableptr)
       free((fptr->Fptr)->tableptr); /* free memory for the old CHDU */

    /* mem for column structures ; space is initialized = 0  */
    if (tfield > 0)
    {
      colptr = (tcolumn *) calloc(tfield, sizeof(tcolumn) );
      if (!colptr)
      {
        ffpmsg
        ("malloc failed to get memory for FITS table descriptors (ffbinit)");
        (fptr->Fptr)->tableptr = 0;  /* set a null table structure pointer */
        return(*status = ARRAY_TOO_BIG);
      }
    }

    /* copy the table structure address to the fitsfile structure */
    (fptr->Fptr)->tableptr = colptr; 

    /* initialize the table field parameters */
    for (ii = 0; ii < tfield; ii++, colptr++)
    {
        colptr->ttype[0] = '\0';  /* null column name */
        colptr->tscale = 1.;
        colptr->tzero  = 0.;
        colptr->tnull  = NULL_UNDEFINED; /* (integer) null value undefined */
        colptr->tdatatype = -9999;   /* initialize to illegal value */
        colptr->trepeat = 1;
        colptr->strnull[0] = '\0'; /* for ASCII string columns (TFORM = rA) */
    }

    /*
      Initialize the heap starting address (immediately following
      the table data) and the size of the heap.  This is used to find the
      end of the table data when checking the fill values in the last block. 
    */
    (fptr->Fptr)->numrows = nrows;
    (fptr->Fptr)->origrows = nrows;
    (fptr->Fptr)->heapstart = rowlen * nrows;
    (fptr->Fptr)->heapsize = pcount;

    (fptr->Fptr)->compressimg = 0;  /* initialize as not a compressed image */

    /* now search for the table column keywords and the END keyword */

    for (nspace = 0, ii = 8; 1; ii++)  /* infinite loop  */
    {
        ffgkyn(fptr, ii, name, value, comm, status);

        /* try to ignore minor syntax errors */
        if (*status == NO_QUOTE)
        {
            strcat(value, "'");
            *status = 0;
        }
        else if (*status == BAD_KEYCHAR)
        {
            *status = 0;
        }

        if (*status == END_OF_FILE)
        {
            ffpmsg("END keyword not found in binary table header (ffbinit).");
            return(*status = NO_END);
        }
        else if (*status > 0)
            return(*status);

        else if (name[0] == 'T')   /* keyword starts with 'T' ? */
            ffgtbp(fptr, name, value, status); /* test if column keyword */

        else if (!FSTRCMP(name, "ZIMAGE"))
        {
            if (value[0] == 'T')
                (fptr->Fptr)->compressimg = 1; /* this is a compressed image */
        }
        else if (!FSTRCMP(name, "END"))  /* is this the END keyword? */
            break;


        if (!name[0] && !value[0] && !comm[0])  /* a blank keyword? */
            nspace++;

        else
            nspace = 0; /* reset number of consecutive spaces before END */
    }

    /* test that all the required keywords were found and have legal values */
    colptr = (fptr->Fptr)->tableptr;  /* set pointer to first column */

    for (ii = 0; ii < tfield; ii++, colptr++)
    {
        if (colptr->tdatatype == -9999)
        {
            ffkeyn("TFORM", ii+1, name, status);  /* construct keyword name */
            snprintf(message,FLEN_ERRMSG,"Required %s keyword not found (ffbinit).", name);
            ffpmsg(message);
            return(*status = NO_TFORM);
        }
    }

    /*
      now we know everything about the table; just fill in the parameters:
      the 'END' record is 80 bytes before the current position, minus
      any trailing blank keywords just before the END keyword.
    */

    (fptr->Fptr)->headend = (fptr->Fptr)->nextkey - (80 * (nspace + 1));
 
    /* the data unit begins at the beginning of the next logical block */
    (fptr->Fptr)->datastart = (((fptr->Fptr)->nextkey - 80) / 2880 + 1) 
                              * 2880;

    /* the next HDU begins in the next logical block after the data  */
    (fptr->Fptr)->headstart[ (fptr->Fptr)->curhdu + 1] = 
         (fptr->Fptr)->datastart +
	 ( ((fptr->Fptr)->heapstart + (fptr->Fptr)->heapsize + 2879) / 2880 * 2880 );

    /* determine the byte offset to the beginning of each column */
    ffgtbc(fptr, &totalwidth, status);

    if (totalwidth != rowlen)
    {
        snprintf(message,FLEN_ERRMSG,
        "NAXIS1 = %ld is not equal to the sum of column widths: %ld", 
        (long) rowlen, (long) totalwidth);
        ffpmsg(message);
        *status = BAD_ROW_WIDTH;
    }

    /* reset next keyword pointer to the start of the header */
    (fptr->Fptr)->nextkey = (fptr->Fptr)->headstart[ (fptr->Fptr)->curhdu ];

    if ( (fptr->Fptr)->compressimg == 1) /*  Is this a compressed image */
        imcomp_get_compressed_image_par(fptr, status);

    return(*status);
}